

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
spirv_cross::Compiler::inherit_expression_dependencies
          (Compiler *this,uint32_t dst,uint32_t source_expression)

{
  int iVar1;
  Variant *pVVar2;
  size_t sVar3;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  undefined8 in_RAX;
  iterator iVar5;
  SPIRExpression *pSVar6;
  SPIRVariable *pSVar7;
  SPIRExpression *pSVar8;
  long lVar9;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *this_00;
  long lVar10;
  TypedID<(spirv_cross::Types)0> *pTVar11;
  int iVar12;
  ulong uVar13;
  TypedID<(spirv_cross::Types)0> *pTVar14;
  undefined8 local_38;
  
  local_38._4_4_ = (uint32_t)((ulong)in_RAX >> 0x20);
  local_38 = CONCAT44(local_38._4_4_,dst);
  iVar5 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->forwarded_temporaries)._M_h,(key_type_conflict *)&local_38);
  if ((iVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) &&
     (iVar5 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->forced_temporaries)._M_h,(key_type_conflict *)&local_38),
     iVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)) {
    pSVar6 = Variant::get<spirv_cross::SPIRExpression>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                        (local_38 & 0xffffffff));
    uVar13 = (ulong)source_expression;
    if ((uVar13 < (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
       ((pVVar2 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
        pVVar2[uVar13].type == TypeVariable &&
        (pSVar7 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar13),
        pSVar7->phi_variable == true)))) {
      local_38 = CONCAT44((key_type_conflict)local_38,(key_type_conflict)local_38);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::reserve
                (&pSVar7->dependees,
                 (pSVar7->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
                 buffer_size + 1);
      sVar3 = (pSVar7->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
              buffer_size;
      (pSVar7->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr[sVar3].
      id = local_38._4_4_;
      (pSVar7->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size
           = sVar3 + 1;
    }
    if ((uVar13 < (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar2 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar2[uVar13].type == TypeExpression)) {
      pSVar8 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + uVar13);
      this_00 = &pSVar6->expression_dependencies;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::reserve
                (this_00,(pSVar6->expression_dependencies).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size
                         + 1);
      sVar3 = (pSVar6->expression_dependencies).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
      pTVar14 = (pSVar6->expression_dependencies).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr + sVar3;
      pTVar14->id = source_expression;
      (pSVar6->expression_dependencies).
      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = sVar3 + 1;
      pTVar11 = (pSVar8->expression_dependencies).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::insert
                (this_00,pTVar14 + 1,pTVar11,
                 pTVar11 + (pSVar8->expression_dependencies).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
                           buffer_size);
      pTVar14 = (pSVar6->expression_dependencies).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      uVar13 = (pSVar6->expression_dependencies).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
      pTVar11 = pTVar14;
      if (uVar13 != 0) {
        lVar9 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        ::std::
        __introsort_loop<spirv_cross::TypedID<(spirv_cross::Types)0>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pTVar14,pTVar14 + uVar13,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        ::std::
        __final_insertion_sort<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_less_iter>
                  (pTVar14,pTVar14 + uVar13);
        pTVar4 = (pSVar6->expression_dependencies).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
        sVar3 = (pSVar6->expression_dependencies).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
        pTVar14 = pTVar4 + sVar3;
        pTVar11 = pTVar14;
        if (sVar3 != 0) {
          lVar9 = 4;
          do {
            lVar10 = lVar9;
            if (sVar3 << 2 == lVar10) goto LAB_003866c2;
            iVar12 = *(int *)((long)&pTVar4[-1].id + lVar10);
            lVar9 = lVar10 + 4;
          } while (iVar12 != *(int *)((long)&pTVar4->id + lVar10));
          lVar10 = (long)&pTVar4[-1].id + lVar10;
          for (; sVar3 << 2 != lVar9; lVar9 = lVar9 + 4) {
            iVar1 = *(int *)((long)&pTVar4->id + lVar9);
            if (iVar12 != iVar1) {
              *(int *)(lVar10 + 4) = iVar1;
              lVar10 = lVar10 + 4;
            }
            iVar12 = iVar1;
          }
          pTVar11 = (TypedID<(spirv_cross::Types)0> *)(lVar10 + 4);
        }
      }
LAB_003866c2:
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::erase(this_00,pTVar11,pTVar14);
    }
  }
  return;
}

Assistant:

void Compiler::inherit_expression_dependencies(uint32_t dst, uint32_t source_expression)
{
	// Don't inherit any expression dependencies if the expression in dst
	// is not a forwarded temporary.
	if (forwarded_temporaries.find(dst) == end(forwarded_temporaries) ||
	    forced_temporaries.find(dst) != end(forced_temporaries))
	{
		return;
	}

	auto &e = get<SPIRExpression>(dst);
	auto *phi = maybe_get<SPIRVariable>(source_expression);
	if (phi && phi->phi_variable)
	{
		// We have used a phi variable, which can change at the end of the block,
		// so make sure we take a dependency on this phi variable.
		phi->dependees.push_back(dst);
	}

	auto *s = maybe_get<SPIRExpression>(source_expression);
	if (!s)
		return;

	auto &e_deps = e.expression_dependencies;
	auto &s_deps = s->expression_dependencies;

	// If we depend on a expression, we also depend on all sub-dependencies from source.
	e_deps.push_back(source_expression);
	e_deps.insert(end(e_deps), begin(s_deps), end(s_deps));

	// Eliminate duplicated dependencies.
	sort(begin(e_deps), end(e_deps));
	e_deps.erase(unique(begin(e_deps), end(e_deps)), end(e_deps));
}